

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void jsondec_wellknown(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  char *pcVar1;
  byte bVar2;
  upb_MessageValue val;
  jsondec *pjVar3;
  _Bool _Var4;
  upb_WellKnown uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  upb_EncodeStatus uVar11;
  upb_FieldDef *puVar12;
  char *pcVar13;
  char *pcVar14;
  upb_MessageDef *puVar15;
  upb_MutableMessageValue arr;
  char *pcVar16;
  upb_MiniTable *puVar17;
  upb_Message *puVar18;
  ulong uVar19;
  char *pcVar21;
  upb_Arena *a;
  char *pcVar22;
  long lVar23;
  size_t __n;
  char *pcVar24;
  upb_StringView uVar25;
  upb_MessageValue uVar26;
  upb_MessageValue val_00;
  _Bool local_89;
  jsondec *local_88;
  upb_MessageValue seconds;
  char local_70;
  undefined8 local_68;
  char *pcStack_60;
  upb_FieldDef *local_58;
  upb_MessageDef *local_50;
  char *local_48;
  upb_Message *local_40;
  char *ptr;
  undefined8 uVar20;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5d6,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  uVar5 = upb_MessageDef_WellKnownType(m);
  local_88 = d;
  local_40 = msg;
  switch(uVar5) {
  case kUpb_WellKnown_Any:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x588,"void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    local_50 = m;
    local_58 = upb_MessageDef_FindFieldByNumber(m,2);
    jsondec_objstart(d);
    pcVar22 = (char *)0x0;
    pcVar24 = (char *)0x0;
    do {
      puVar15 = (upb_MessageDef *)0x0;
      while( true ) {
        pcVar16 = pcVar24;
        pjVar3 = local_88;
        if (puVar15 != (upb_MessageDef *)0x0) {
          puVar17 = upb_MessageDef_MiniTable(puVar15);
          pjVar3 = local_88;
          puVar18 = upb_Message_New(puVar17,local_88->arena);
          msg = local_40;
          if (pcVar16 != (char *)0x0) {
            __n = (long)pcVar22 - (long)pcVar16;
            pcVar22 = (char *)upb_Arena_Malloc(pjVar3->arena,__n + 1);
            local_68 = (upb_FieldDef *)pjVar3->ptr;
            pcStack_60 = pjVar3->end;
            memcpy(pcVar22,pcVar16,__n);
            pcVar22[__n] = '}';
            pjVar3->ptr = pcVar22;
            pjVar3->end = pcVar22 + __n + 1;
            pjVar3->is_first = true;
            while (_Var4 = jsondec_objnext(pjVar3), _Var4) {
              jsondec_anyfield(pjVar3,puVar18,puVar15);
            }
            pjVar3->ptr = (char *)local_68;
            pjVar3->end = pcStack_60;
            msg = local_40;
          }
          while (_Var4 = jsondec_objnext(pjVar3), _Var4) {
            jsondec_anyfield(pjVar3,puVar18,puVar15);
          }
          jsondec_objend(pjVar3);
          puVar17 = upb_MessageDef_MiniTable(puVar15);
          uVar11 = upb_Encode(puVar18,puVar17,0,pjVar3->arena,(char **)&seconds.array_val,
                              &seconds.str_val.size);
          if (uVar11 != kUpb_EncodeStatus_Ok) {
            __assert_fail("status == kUpb_EncodeStatus_Ok",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                          ,0x5c7,
                          "void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
          }
          a = pjVar3->arena;
          uVar20 = seconds.double_val;
          puVar12 = local_58;
          goto LAB_002a29f9;
        }
        _Var4 = jsondec_objnext(local_88);
        if (!_Var4) {
          jsondec_err(pjVar3,"Any object didn\'t contain a \'@type\' field");
        }
        pcVar24 = pjVar3->ptr;
        uVar25 = jsondec_string(pjVar3);
        jsondec_entrysep(pjVar3);
        _Var4 = jsondec_streql(uVar25,"@type");
        puVar18 = local_40;
        if (!_Var4) break;
        local_48 = pcVar24;
        if (((ulong)local_40->field_0 & 1) != 0) {
          __assert_fail("!upb_Message_IsFrozen(msg)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                        ,0x56a,
                        "const upb_MessageDef *jsondec_typeurl(jsondec *, upb_Message *, const upb_MessageDef *)"
                       );
        }
        local_68 = upb_MessageDef_FindFieldByNumber(local_50,1);
        pjVar3 = local_88;
        uVar26.str_val = jsondec_string(local_88);
        pcVar13 = uVar26.str_val.data;
        pcVar24 = pcVar13 + uVar26.str_val.size;
        upb_Message_SetFieldByDef(puVar18,local_68,uVar26,pjVar3->arena);
        pcVar14 = pcVar24;
        do {
          pcVar21 = pcVar14;
          if (pcVar14 <= pcVar13) break;
          pcVar21 = pcVar14 + -1;
          pcVar1 = pcVar14 + -1;
          pcVar14 = pcVar21;
        } while (*pcVar1 != '/');
        if ((pcVar21 == pcVar13) || (pcVar21 == pcVar24)) {
          pcVar22 = "Type url must have at least one \'/\' and non-empty host";
          goto LAB_002a30a2;
        }
        puVar15 = upb_DefPool_FindMessageByNameWithSize
                            (local_88->symtab,pcVar21 + 1,(long)pcVar24 - (long)(pcVar21 + 1));
        if (puVar15 == (upb_MessageDef *)0x0) {
          pcVar22 = "Type was not found";
          goto LAB_002a30a2;
        }
        pcVar24 = (char *)0x0;
        if (pcVar16 != (char *)0x0) {
          pcVar22 = local_48 + 1;
          do {
            pcVar14 = pcVar22 + -1;
            pcVar22 = pcVar22 + -1;
            pcVar24 = pcVar16;
          } while (*pcVar14 != ',');
        }
      }
      if (pcVar16 != (char *)0x0) {
        pcVar24 = pcVar16;
      }
      jsondec_skipval(pjVar3);
    } while( true );
  case kUpb_WellKnown_FieldMask:
    if (((ulong)msg->field_0 & 1) == 0) {
      puVar12 = upb_MessageDef_FindFieldByNumber(m,1);
      arr = upb_Message_Mutable(msg,puVar12,d->arena);
      uVar25 = jsondec_string(d);
      pcVar22 = uVar25.data;
      pcVar24 = pcVar22 + uVar25.size;
      while (pcVar22 < pcVar24) {
        pcVar16 = (char *)memchr(pcVar22,0x2c,(long)pcVar24 - (long)pcVar22);
        if (pcVar16 == (char *)0x0) {
          uVar26.str_val = jsondec_mask(d,pcVar22,pcVar24);
          pcVar22 = pcVar24;
        }
        else {
          uVar26.str_val = jsondec_mask(d,pcVar22,pcVar16);
          pcVar22 = pcVar16 + 1;
        }
        upb_Array_Append(arr.array,uVar26,d->arena);
      }
      return;
    }
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x53f,"void jsondec_fieldmask(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  case kUpb_WellKnown_Duration:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x49b,"void jsondec_duration(jsondec *, upb_Message *, const upb_MessageDef *)"
                   );
    }
    uVar25 = jsondec_string(d);
    ptr = uVar25.data;
    pcVar22 = ptr + uVar25.size;
    local_89 = false;
    ptr = jsondec_buftoint64(d,ptr,pcVar22,&seconds.int64_val,&local_89);
    uVar6 = jsondec_nanos(d,&ptr,pcVar22);
    if (((long)pcVar22 - (long)ptr != 1) || (*ptr != 's')) {
      pcVar22 = "Malformed duration";
LAB_002a31a1:
      jsondec_err(d,pcVar22);
    }
    if (seconds.int64_val - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
      pcVar22 = "Duration out of range";
      goto LAB_002a31a1;
    }
    uVar10 = -uVar6;
    if (local_89 == false) {
      uVar10 = uVar6;
    }
    puVar12 = upb_MessageDef_FindFieldByNumber(m,1);
    val.str_val.size = seconds.str_val.size;
    val.double_val = seconds.double_val;
    upb_Message_SetFieldByDef(msg,puVar12,val,d->arena);
    puVar12 = upb_MessageDef_FindFieldByNumber(m,2);
    a = d->arena;
LAB_002a3040:
    uVar20 = (ulong)uVar10;
LAB_002a29f9:
    val_00.str_val.size = seconds.str_val.size;
    val_00.double_val = (double)uVar20;
    upb_Message_SetFieldByDef(msg,puVar12,val_00,a);
    return;
  case kUpb_WellKnown_Timestamp:
    break;
  case kUpb_WellKnown_DoubleValue:
  case kUpb_WellKnown_FloatValue:
  case kUpb_WellKnown_Int64Value:
  case kUpb_WellKnown_UInt64Value:
  case kUpb_WellKnown_Int32Value:
  case kUpb_WellKnown_UInt32Value:
  case kUpb_WellKnown_StringValue:
  case kUpb_WellKnown_BytesValue:
  case kUpb_WellKnown_BoolValue:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5cd,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    puVar12 = upb_MessageDef_FindFieldByNumber(m,1);
    jsondec_value((upb_JsonMessageValue *)&seconds.str_val,d,puVar12);
    if (local_70 != '\0') {
      __assert_fail("val.ignore == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5d0,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    a = d->arena;
    uVar20 = seconds.double_val;
    goto LAB_002a29f9;
  case kUpb_WellKnown_Value:
    jsondec_wellknownvalue(d,msg,m);
    return;
  case kUpb_WellKnown_ListValue:
    jsondec_listvalue(d,msg,m);
    return;
  case kUpb_WellKnown_Struct:
    jsondec_struct(d,msg,m);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5f9,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  if (((ulong)msg->field_0 & 1) != 0) {
    local_50 = m;
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x459,"void jsondec_timestamp(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  local_50 = m;
  uVar25 = jsondec_string(d);
  pjVar3 = local_88;
  seconds.int64_val = (int64_t)uVar25.data;
  if (0x13 < uVar25.size) {
    pcVar22 = (char *)((long)seconds.array_val + uVar25.size);
    iVar7 = jsondec_tsdigits(local_88,(char **)&seconds.array_val,4,"-");
    iVar8 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,"-");
    local_68 = (upb_FieldDef *)CONCAT44(local_68._4_4_,iVar8);
    iVar8 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,"T");
    local_48 = (char *)CONCAT44(local_48._4_4_,iVar8);
    iVar8 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,":");
    local_58 = (upb_FieldDef *)CONCAT44(local_58._4_4_,iVar8);
    iVar8 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,":");
    iVar9 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,(char *)0x0);
    iVar7 = jsondec_epochdays(iVar7,(int)local_68,(int)local_48);
    uVar10 = jsondec_nanos(pjVar3,(char **)&seconds.array_val,pcVar22);
    pjVar3 = local_88;
    if (seconds._0_8_ != pcVar22) {
      lVar23 = (long)iVar9 + (long)(iVar8 * 0x3c) + (long)((int)local_58 * 0xe10) +
               (long)iVar7 * 0x15180;
      pcVar24 = (char *)(seconds.int64_val + 1);
      bVar2 = (seconds.map_val)->key_size;
      uVar19 = (ulong)bVar2;
      seconds.array_val = (upb_Array *)pcVar24;
      if (bVar2 == 0x2b) {
        local_68 = (upb_FieldDef *)((ulong)local_68._4_4_ << 0x20);
LAB_002a2f8a:
        if ((long)pcVar22 - (long)pcVar24 == 5) {
          iVar7 = jsondec_tsdigits(local_88,(char **)&seconds.array_val,2,":");
          iVar8 = jsondec_tsdigits(pjVar3,(char **)&seconds.array_val,2,(char *)0x0);
          iVar8 = iVar7 * 0x3c + iVar8;
          uVar6 = iVar8 * -0x3c;
          if ((char)local_68 != '\0') {
            uVar6 = iVar8 * 0x3c;
          }
          uVar19 = (ulong)uVar6;
          lVar23 = lVar23 + (int)uVar6;
LAB_002a2fe6:
          puVar15 = local_50;
          if (lVar23 < -0xe7791f700) {
            pcVar22 = "Timestamp out of range";
            goto LAB_002a30a2;
          }
          puVar12 = upb_MessageDef_FindFieldByNumber(local_50,1);
          msg = local_40;
          pjVar3 = local_88;
          uVar26.str_val.size = uVar19;
          uVar26.int64_val = lVar23;
          upb_Message_SetFieldByDef(local_40,puVar12,uVar26,local_88->arena);
          puVar12 = upb_MessageDef_FindFieldByNumber(puVar15,2);
          a = pjVar3->arena;
          seconds.str_val.size = uVar19;
          goto LAB_002a3040;
        }
      }
      else if (bVar2 == 0x5a) {
        if (pcVar24 == pcVar22) goto LAB_002a2fe6;
      }
      else if (bVar2 == 0x2d) {
        local_68 = (upb_FieldDef *)CONCAT44(local_68._4_4_,1);
        goto LAB_002a2f8a;
      }
    }
  }
  pcVar22 = "Malformed timestamp";
LAB_002a30a2:
  jsondec_err(local_88,pcVar22);
}

Assistant:

static void jsondec_wellknown(jsondec* d, upb_Message* msg,
                              const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  switch (upb_MessageDef_WellKnownType(m)) {
    case kUpb_WellKnown_Any:
      jsondec_any(d, msg, m);
      break;
    case kUpb_WellKnown_FieldMask:
      jsondec_fieldmask(d, msg, m);
      break;
    case kUpb_WellKnown_Duration:
      jsondec_duration(d, msg, m);
      break;
    case kUpb_WellKnown_Timestamp:
      jsondec_timestamp(d, msg, m);
      break;
    case kUpb_WellKnown_Value:
      jsondec_wellknownvalue(d, msg, m);
      break;
    case kUpb_WellKnown_ListValue:
      jsondec_listvalue(d, msg, m);
      break;
    case kUpb_WellKnown_Struct:
      jsondec_struct(d, msg, m);
      break;
    case kUpb_WellKnown_DoubleValue:
    case kUpb_WellKnown_FloatValue:
    case kUpb_WellKnown_Int64Value:
    case kUpb_WellKnown_UInt64Value:
    case kUpb_WellKnown_Int32Value:
    case kUpb_WellKnown_UInt32Value:
    case kUpb_WellKnown_StringValue:
    case kUpb_WellKnown_BytesValue:
    case kUpb_WellKnown_BoolValue:
      jsondec_wrapper(d, msg, m);
      break;
    default:
      UPB_UNREACHABLE();
  }
}